

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O3

void eatspecial(void)

{
  ushort uVar1;
  obj *otmp;
  byte bVar2;
  boolean bVar3;
  short sVar4;
  uint uVar5;
  ulong uVar6;
  int tmp;
  int iVar7;
  uint uVar8;
  int incr;
  long numused;
  char *pcVar9;
  int ndx;
  
  otmp = victual.piece;
  set_occupation(eatfood,"eating non-food",0);
  lesshungry(victual.nmod);
  victual.piece = (obj *)0x0;
  victual._20_1_ = victual._20_1_ & 0xfb;
  occupation = (_func_int *)0x0;
  bVar2 = otmp->oclass;
  if (bVar2 == 8) {
    otmp->quan = otmp->quan + 1;
    dopotion(otmp);
    bVar2 = otmp->oclass;
  }
  else if (bVar2 == 0xc) {
    if (otmp->where == '\0') {
      dealloc_obj(otmp);
      return;
    }
    numused = (long)otmp->quan;
    goto LAB_001900c0;
  }
  uVar1 = otmp->otyp;
  iVar7 = (int)(short)uVar1;
  if ((bVar2 & 0xfe) != 4) {
    if ((iVar7 == 0xf1) && (otmp->corpsenm != 0)) {
      o_unleash(otmp);
    }
    goto switchD_0018ff0b_caseD_a9;
  }
  uVar8 = u.uprops[objects[iVar7].oc_oprop].intrinsic;
  if ((uleft == otmp) || (uright == otmp)) {
    Ring_gone(otmp);
    if (u.uhp < 1) goto switchD_0018ff0b_caseD_a9;
    bVar2 = otmp->oclass;
  }
  otmp->field_0x4a = otmp->field_0x4a | 0x30;
  uVar5 = mt_random();
  if (uVar5 % ((uint)(bVar2 != 4) * 2 + 3) != 0) goto switchD_0018ff0b_caseD_a9;
  switch(otmp->otyp) {
  case 0x9d:
    pcVar9 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar9 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar9);
    incr = (int)otmp->spe;
    ndx = 5;
    goto LAB_00190292;
  case 0x9e:
    pcVar9 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar9 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar9);
    incr = (int)otmp->spe;
    ndx = 0;
    goto LAB_00190292;
  case 0x9f:
    pcVar9 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar9 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar9);
    incr = (int)otmp->spe;
    ndx = 4;
    goto LAB_00190292;
  case 0xa0:
    pcVar9 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar9 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar9);
    incr = (int)otmp->spe;
    ndx = 1;
    goto LAB_00190292;
  case 0xa1:
    pcVar9 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar9 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar9);
    incr = (int)otmp->spe;
    ndx = 2;
    goto LAB_00190292;
  case 0xa2:
    pcVar9 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar9 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar9);
    incr = (int)otmp->spe;
    ndx = 3;
LAB_00190292:
    bVar3 = adjattrib(ndx,incr,'\0',-1);
    if (bVar3 != '\0') {
LAB_001902a8:
      discover_object(iVar7,'\x01','\x01');
    }
    break;
  case 0xa3:
    pcVar9 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar9 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar9);
    u.uhitinc = u.uhitinc + otmp->spe;
    break;
  case 0xa4:
    pcVar9 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar9 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar9);
    u.udaminc = u.udaminc + otmp->spe;
    break;
  case 0xa5:
    pcVar9 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar9 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar9);
    u.uprops[0x16].intrinsic._3_1_ = u.uprops[0x16].intrinsic._3_1_ | 4;
    u.ublessed = u.ublessed + otmp->spe;
LAB_001904b3:
    iflags.botl = '\x01';
    break;
  case 0xa6:
  case 0xa7:
  case 0xa8:
  case 0xaa:
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
  case 0xb0:
  case 0xb1:
  case 0xb2:
switchD_0018ff0b_caseD_a6:
    uVar6 = (ulong)objects[iVar7].oc_oprop;
    if (uVar6 == 0) break;
    uVar5 = u.uprops[uVar6].intrinsic;
    if ((uVar5 >> 0x1a & 1) == 0) {
      pcVar9 = "amulet";
      if (otmp->oclass == '\x04') {
        pcVar9 = "ring";
      }
      pline("Magic spreads through your body as you digest the %s.",pcVar9);
      uVar6 = (ulong)objects[iVar7].oc_oprop;
      uVar5 = u.uprops[uVar6].intrinsic;
    }
    u.uprops[uVar6].intrinsic = uVar5 | 0x4000000;
    if (0xb9 < uVar1) {
      if (uVar1 == 0xbb) {
        resistcham();
      }
      else if (uVar1 == 0xba) {
        set_mimic_blocking();
        see_monsters();
        if (((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
               (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
             (u.uprops[0xd].blocked == 0)) && (uVar8 == 0)) &&
           ((u.uprops[0xc].extrinsic == 0 &&
            (uVar8 = (youmonst.data)->mflags1, (uVar8 >> 0x18 & 1) == 0)))) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if (ublindf == (obj *)0x0) {
              if ((uVar8 >> 0xc & 1) != 0) break;
            }
            else if (((uVar8 >> 0xc & 1) != 0) || (ublindf->otyp != 0xed)) goto LAB_0019063e;
LAB_0019077c:
            newsym((int)u.ux,(int)u.uy);
            pline("Suddenly you can see yourself.");
            iVar7 = 0xba;
            goto LAB_001902a8;
          }
          if (ublindf != (obj *)0x0) {
LAB_0019063e:
            if (ublindf->oartifact == '\x1d') goto LAB_0019077c;
          }
        }
      }
      break;
    }
    if (uVar1 != 0xaa) {
      if ((((uVar1 == 0xb9) && (uVar8 == 0)) && (u.uprops[0xd].extrinsic == 0)) &&
         (((u.uprops[0xd].blocked == 0 && (u.uprops[0xc].intrinsic == 0)) &&
          ((u.uprops[0xc].extrinsic == 0 &&
           (uVar8 = (youmonst.data)->mflags1, (uVar8 >> 0x18 & 1) == 0)))))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if (ublindf == (obj *)0x0) {
            if ((uVar8 >> 0xc & 1) != 0) break;
          }
          else if (((uVar8 >> 0xc & 1) != 0) || (ublindf->otyp != 0xed)) goto LAB_0019043f;
LAB_0019072b:
          newsym((int)u.ux,(int)u.uy);
          pcVar9 = "strange";
          if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
            if (u.umonnum == u.umonster) {
              pcVar9 = "normal";
            }
            else {
              bVar3 = dmgtype(youmonst.data,0x24);
              pcVar9 = "strange";
              if (bVar3 == '\0') {
                pcVar9 = "normal";
              }
            }
          }
          pline("Your body takes on a %s transparency...",pcVar9);
          iVar7 = 0xb9;
          goto LAB_001902a8;
        }
        if (ublindf != (obj *)0x0) {
LAB_0019043f:
          if (ublindf->oartifact == '\x1d') goto LAB_0019072b;
        }
      }
      break;
    }
    u.uprops[0x12].intrinsic = uVar8;
    if ((uVar8 != 0 || u.uprops[0x12].extrinsic != 0) || ((youmonst.data)->mlet == '\x05')) break;
    float_up();
    uVar8 = 10;
    iVar7 = -10;
    do {
      uVar5 = mt_random();
      uVar8 = uVar8 + uVar5 % 0x14;
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0);
    incr_itimeout(&u.uprops[0x12].intrinsic,(ulong)uVar8);
    iVar7 = 0xaa;
    goto LAB_001902a8;
  case 0xa9:
    break;
  case 0xb3:
    uVar8 = u.uprops[3].intrinsic;
    if ((u.uprops[3].intrinsic >> 0x1a & 1) == 0) {
      pcVar9 = "amulet";
      if (otmp->oclass == '\x04') {
        pcVar9 = "ring";
      }
      pline("Magic spreads through your body as you digest the %s.",pcVar9);
      uVar8 = u.uprops[3].intrinsic;
      if (u.uprops[3].extrinsic == 0 && u.uprops[3].intrinsic == 0) {
        if (((byte)youmonst.mintrinsics & 4) == 0) {
          uVar8 = 0;
          if (u.uprops[0x38].extrinsic == 0) {
            pline("You feel wide awake.");
            uVar8 = u.uprops[3].intrinsic;
          }
        }
        else {
          uVar8 = 0;
        }
      }
    }
    u.uprops[3].intrinsic = uVar8 | 0x4000000;
    break;
  default:
    switch(otmp->otyp) {
    case 0xca:
    case 0xd0:
      break;
    case 0xcb:
      choke(otmp);
      break;
    case 0xcc:
      if ((u.uprops[0x1f].intrinsic & 0x4000000) == 0) {
        pcVar9 = "amulet";
        if (otmp->oclass == '\x04') {
          pcVar9 = "ring";
        }
        pline("Magic spreads through your body as you digest the %s.",pcVar9);
      }
      uVar8 = mt_random();
      u.uprops[0x1f].intrinsic = uVar8 % 100 + 0x4000001;
      break;
    default:
      goto switchD_0018ff0b_caseD_a6;
    case 0xce:
      pcVar9 = "amulet";
      if (otmp->oclass == '\x04') {
        pcVar9 = "ring";
      }
      pline("Magic spreads through your body as you digest the %s.",pcVar9);
      discover_object(iVar7,'\x01','\x01');
      change_sex();
      pcVar9 = "feminine";
      if (flags.female == '\0') {
        pcVar9 = "masculine";
      }
      pline("You are suddenly very %s!",pcVar9);
      goto LAB_001904b3;
    case 0xcf:
      if ((u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0) &&
         (u.umonnum != u.umonster)) {
        pcVar9 = "amulet";
        if (otmp->oclass == '\x04') {
          pcVar9 = "ring";
        }
        pline("Magic spreads through your body as you digest the %s.",pcVar9);
        discover_object(iVar7,'\x01','\x01');
        rehumanize();
      }
    }
  }
switchD_0018ff0b_caseD_a9:
  sVar4 = otmp->otyp;
  if (sVar4 == 0x10) {
    if ((otmp->field_0x4a & 1) == 0) {
      pcVar9 = "That was pure chewing satisfaction!";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum == u.umonster) {
          pcVar9 = "Four out of five dentists agree.";
        }
        else {
          bVar3 = dmgtype(youmonst.data,0x24);
          pcVar9 = "That was pure chewing satisfaction!";
          if (bVar3 == '\0') {
            pcVar9 = "Four out of five dentists agree.";
          }
        }
      }
      pline(pcVar9);
      exercise(2,'\x01');
      sVar4 = otmp->otyp;
      goto LAB_0018fffd;
    }
  }
  else {
LAB_0018fffd:
    if ((sVar4 == 0x212) && ((otmp->field_0x4a & 1) == 0)) {
      pline("Yabba-dabba delicious!");
      exercise(4,'\x01');
    }
  }
  if ((otmp == uwep) && (otmp->quan == 1)) {
    uwepgone();
  }
  if ((otmp == uquiver) && (otmp->quan == 1)) {
    uqwepgone();
  }
  if ((otmp == uswapwep) && (otmp->quan == 1)) {
    uswapwepgone();
  }
  if (otmp == uball) {
    unpunish();
  }
  if (otmp == uchain) {
    unpunish();
    return;
  }
  if (otmp->where == '\x03') {
    useup(otmp);
    return;
  }
  numused = 1;
LAB_001900c0:
  useupf(otmp,numused);
  return;
}

Assistant:

static void eatspecial(void) /* called after eating non-food */
{
	struct obj *otmp = victual.piece;

	/* lesshungry wants an occupation to handle choke messages correctly */
	set_occupation(eatfood, "eating non-food", 0);
	lesshungry(victual.nmod);
	occupation = 0;
	victual.piece = NULL;
	victual.eating = 0;
	if (otmp->oclass == COIN_CLASS) {
		if (otmp->where == OBJ_FREE)
		    dealloc_obj(otmp);
		else
		    useupf(otmp, otmp->quan);
		return;
	}
	if (otmp->oclass == POTION_CLASS) {
		otmp->quan++; /* dopotion() does a useup() */
		dopotion(otmp);
	}
	if (otmp->oclass == RING_CLASS || otmp->oclass == AMULET_CLASS)
		eataccessory(otmp);
	else if (otmp->otyp == LEASH && otmp->leashmon)
		o_unleash(otmp);

	/* KMH -- idea by "Tommy the Terrorist" */
	if ((otmp->otyp == TRIDENT) && !otmp->cursed)
	{
		pline(Hallucination ? "Four out of five dentists agree." :
				"That was pure chewing satisfaction!");
		exercise(A_WIS, TRUE);
	}
	if ((otmp->otyp == FLINT) && !otmp->cursed)
	{
		pline("Yabba-dabba delicious!");
		exercise(A_CON, TRUE);
	}

	if (otmp == uwep && otmp->quan == 1L) uwepgone();
	if (otmp == uquiver && otmp->quan == 1L) uqwepgone();
	if (otmp == uswapwep && otmp->quan == 1L) uswapwepgone();

	if (otmp == uball) unpunish();
	if (otmp == uchain) unpunish(); /* but no useup() */
	else if (carried(otmp)) useup(otmp);
	else useupf(otmp, 1L);
}